

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmSwitch::gen_code(CTPNStmSwitch *this,int param_2,int param_3)

{
  CTcPrsNode *pCVar1;
  uint uVar2;
  CTPNStmEnclosing *stm;
  CTPNStmSwitch *sw;
  CTcStreamAnchor *lbl;
  ulong uVar3;
  CTcStreamAnchor *pCVar4;
  CTcCodeStream *in_RDI;
  CTPNStmEnclosing *old_enclosing;
  CTcCodeLabel *end_lbl;
  char buf [7];
  int i;
  CTPNStmSwitch *enclosing_switch;
  uchar in_stack_000000af;
  CTcGenTarg *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  CTPNStm *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  stm = CTcCodeStream::set_enclosing(G_cs,(CTPNStmEnclosing *)in_RDI);
  pCVar1 = (CTcPrsNode *)(in_RDI->super_CTcDataStream).page_cur_;
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar1,0);
  sw = CTcCodeStream::set_switch(G_cs,(CTPNStmSwitch *)in_RDI);
  uVar2 = (*(((CTPNStmEnclosing *)&(in_RDI->super_CTcDataStream)._vptr_CTcDataStream)->super_CTPNStm
            ).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1c])
                    (in_RDI,0);
  if ((uVar2 & 1) == 0) {
    lbl = (CTcStreamAnchor *)0x0;
  }
  else {
    lbl = (CTcStreamAnchor *)CTcCodeStream::new_label_fwd(in_RDI);
  }
  (in_RDI->super_CTcDataStream).last_anchor_ = lbl;
  CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
  CTcGenTarg::note_pop((CTcGenTarg *)0x2de841);
  CTcDataStream::write2(&in_RDI->super_CTcDataStream,in_stack_ffffffffffffffbc);
  uVar3 = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  (in_RDI->super_CTcDataStream).page_cnt_ = uVar3;
  memset(&stack0xffffffffffffffdd,0,7);
  for (iVar5 = 0; iVar5 < (int)(in_RDI->super_CTcDataStream).page_slots_; iVar5 = iVar5 + 1) {
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)&stack0xffffffffffffffdd,(void *)0x7,(size_t)in_RDI);
  }
  if (((in_RDI->super_CTcDataStream).page_slots_ & 0x100000000) == 0) {
    CTcCodeStream::write_ofs2
              (in_RDI,(CTcCodeLabel *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               0);
  }
  else {
    pCVar4 = (CTcStreamAnchor *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    (in_RDI->super_CTcDataStream).first_anchor_ = pCVar4;
    CTcDataStream::write2(&in_RDI->super_CTcDataStream,in_stack_ffffffffffffffbc);
  }
  if ((in_RDI->super_CTcDataStream).pages_ != (char **)0x0) {
    CTPNStmBase::gen_code_substm
              ((CTPNStmBase *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  if (lbl != (CTcStreamAnchor *)0x0) {
    CTcPrsNode::def_label_pos((CTcCodeLabel *)lbl);
  }
  CTcCodeStream::set_switch(G_cs,sw);
  CTcCodeStream::set_enclosing(G_cs,stm);
  return;
}

Assistant:

void CTPNStmSwitch::gen_code(int, int)
{
    CTPNStmSwitch *enclosing_switch;
    int i;
    char buf[VMB_DATAHOLDER + VMB_UINT2];
    CTcCodeLabel *end_lbl;
    CTPNStmEnclosing *old_enclosing;

    /* add a line record */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);

    /* 
     *   Generate the controlling expression.  We want to keep the value,
     *   hence 'discard' is false, and we need assignment (not 'for
     *   condition') conversion rules, because we're going to use the
     *   value in direct comparisons 
     */
    expr_->gen_code(FALSE, FALSE);

    /* make myself the current innermost switch */
    enclosing_switch = G_cs->set_switch(this);

    /*
     *   if we can flow out of the switch, allocate a label for the end of
     *   the switch body 
     */
    if ((get_control_flow(FALSE) & TCPRS_FLOW_NEXT) != 0)
        end_lbl = G_cs->new_label_fwd();
    else
        end_lbl = 0;

    /* the end label is the 'break' location for subnodes */
    break_lbl_ = end_lbl;

    /*
     *   Write my SWITCH opcode, and the placeholder case table.  We'll
     *   fill in the case table with its real values as we encounter the
     *   cases in the course of generating the code.  For now, all we know
     *   is the number of cases we need to put into the table.  
     */
    G_cg->write_op(OPC_SWITCH);

    /* the SWITCH opcode pops the controlling expression value */
    G_cg->note_pop();

    /* write the number of cases */
    G_cs->write2(case_cnt_);

    /* 
     *   remember where the first case slot is - the 'case' parse nodes
     *   will use this to figure out where to write their slot data 
     */
    case_slot_ofs_ = G_cs->get_ofs();

    /* 
     *   Write the placeholder case slots - each case slot gets a
     *   DATA_HOLDER for the case value, plus an INT2 for the branch
     *   offset.  For now, completely zero each case slot.  
     */
    memset(buf, 0, VMB_DATAHOLDER + VMB_UINT2);
    for (i = 0 ; i < case_cnt_ ; ++i)
        G_cs->write(buf, VMB_DATAHOLDER + VMB_UINT2);

    /* write a placeholder for the default jump */
    if (has_default_)
    {
        /* 
         *   remember where the 'default' slot is, so that the 'default'
         *   parse node can figure out where to write its branch offset
         */
        default_slot_ofs_ = G_cs->get_ofs();
        
        /* 
         *   Write the placeholder for the 'default' slot - this just gets
         *   an INT2 for the 'default' jump offset.  As with the case
         *   labels, just zero it for now; we'll fill it in later when we
         *   encounter the 'default' case.  
         */
        G_cs->write2(0);
    }
    else
    {
        /* 
         *   there's no default slot, so the 'default' slot is simply a
         *   jump to the end of the switch body - generate a jump ahead to
         *   our end label 
         */
        G_cs->write_ofs2(end_lbl, 0);
    }

    /* 
     *   generate the switch body - this will fill in the case table as we
     *   encounter the 'case' nodes in the parse tree
     */
    if (body_ != 0)
        gen_code_substm(body_);

    /* 
     *   We're past the body - if we have an end label, set it here.  (We
     *   won't have created an end label if control can't flow out of the
     *   switch; this allows us to avoid generating unreachable instructions
     *   after the switch, which would only increase the code size for no
     *   reason.)  
     */
    if (end_lbl != 0)
        def_label_pos(end_lbl);

    /* restore the enclosing switch */
    G_cs->set_switch(enclosing_switch);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}